

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariationalBayesEstimatorOnLDA.cpp
# Opt level: O2

void __thiscall
VariationalBayesEstimatorOnLDA::initializeParam(VariationalBayesEstimatorOnLDA *this)

{
  long lVar1;
  pointer pdVar2;
  pointer pdVar3;
  uint uVar4;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  *pvVar5;
  int k_7;
  pointer pvVar6;
  pointer pvVar7;
  double *pdVar8;
  int k_3;
  int d_5;
  double *pdVar9;
  long lVar10;
  pointer pvVar11;
  int v;
  int k_4;
  long lVar12;
  int d;
  ulong uVar13;
  int k_2;
  ulong uVar14;
  int d_4;
  long lVar15;
  result_type_conflict1 rVar16;
  double dVar17;
  double dVar18;
  allocator_type local_2791;
  value_type_conflict2 local_2790;
  vector<double,_std::allocator<double>_> *local_2788;
  vector<double,_std::allocator<double>_> ndkSum;
  uniform_real_distribution<double> local_2758;
  random_device rnd;
  mt19937 mt;
  
  lVar15 = 0;
  uVar13 = 0;
  while( true ) {
    pvVar7 = (this->_thetaEx).
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)(((long)(this->_thetaEx).
                       super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar7) / 0x18) <= uVar13)
    break;
    rnd.field_0.field_0._M_file = (void *)0x0;
    std::vector<double,_std::allocator<double>_>::_M_fill_assign
              ((vector<double,_std::allocator<double>_> *)
               ((long)&(pvVar7->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                       super__Vector_impl_data + lVar15),(ulong)this->_K,
               (value_type_conflict2 *)&rnd);
    uVar13 = uVar13 + 1;
    lVar15 = lVar15 + 0x18;
  }
  lVar15 = 0;
  uVar13 = 0;
  while( true ) {
    pvVar7 = (this->_phiEx).
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)(((long)(this->_phiEx).
                       super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar7) / 0x18) <= uVar13)
    break;
    rnd.field_0.field_0._M_file = (void *)0x0;
    std::vector<double,_std::allocator<double>_>::_M_fill_assign
              ((vector<double,_std::allocator<double>_> *)
               ((long)&(pvVar7->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                       super__Vector_impl_data + lVar15),(ulong)this->_V,
               (value_type_conflict2 *)&rnd);
    uVar13 = uVar13 + 1;
    lVar15 = lVar15 + 0x18;
  }
  lVar15 = 0;
  uVar13 = 0;
  while( true ) {
    pvVar7 = (this->_ndk).
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)(((long)(this->_ndk).
                       super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar7) / 0x18) <= uVar13)
    break;
    rnd.field_0.field_0._M_file = (void *)0x0;
    std::vector<double,_std::allocator<double>_>::_M_fill_assign
              ((vector<double,_std::allocator<double>_> *)
               ((long)&(pvVar7->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                       super__Vector_impl_data + lVar15),(ulong)this->_K,
               (value_type_conflict2 *)&rnd);
    uVar13 = uVar13 + 1;
    lVar15 = lVar15 + 0x18;
  }
  lVar15 = 0;
  uVar13 = 0;
  while( true ) {
    pvVar7 = (this->_nkv).
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)(((long)(this->_nkv).
                       super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar7) / 0x18) <= uVar13)
    break;
    rnd.field_0.field_0._M_file = (void *)0x0;
    std::vector<double,_std::allocator<double>_>::_M_fill_assign
              ((vector<double,_std::allocator<double>_> *)
               ((long)&(pvVar7->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                       super__Vector_impl_data + lVar15),(ulong)this->_V,
               (value_type_conflict2 *)&rnd);
    uVar13 = uVar13 + 1;
    lVar15 = lVar15 + 0x18;
  }
  rnd.field_0.field_0._M_file = (void *)0x0;
  std::vector<double,_std::allocator<double>_>::_M_fill_assign
            (&this->_nk,(ulong)this->_K,(value_type_conflict2 *)&rnd);
  std::random_device::random_device(&rnd);
  uVar4 = std::random_device::_M_getval();
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::seed(&mt,(ulong)uVar4);
  local_2758._M_param._M_a = 0.0;
  local_2758._M_param._M_b = 1.0;
  pvVar5 = this->_docVoca;
  pvVar6 = (pvVar5->
           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar13 = 0;
  while( true ) {
    if ((ulong)(((long)(pvVar5->
                       super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish - (long)pvVar6) / 0x18) <= uVar13
       ) break;
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              *)&ndkSum,
             (long)*(pointer *)
                    ((long)&pvVar6[uVar13].
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data + 8) -
             *(long *)&pvVar6[uVar13].
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data >> 2,(allocator_type *)&local_2790);
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::_M_move_assign((this->_qz).
                     super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + uVar13);
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               *)&ndkSum);
    uVar14 = 0;
    while( true ) {
      pvVar5 = this->_docVoca;
      pvVar6 = (pvVar5->
               super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      if ((ulong)((long)*(pointer *)
                         ((long)&pvVar6[uVar13].
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data + 8) -
                  *(long *)&pvVar6[uVar13].
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data >> 2) <= uVar14) break;
      local_2788 = (vector<double,_std::allocator<double>_> *)uVar14;
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)
                 &ndkSum.super__Vector_base<double,_std::allocator<double>_>,(ulong)this->_K,
                 (allocator_type *)&local_2790);
      lVar15 = (long)local_2788 * 0x18;
      std::vector<double,_std::allocator<double>_>::_M_move_assign
                ((vector<double,_std::allocator<double>_> *)
                 (*(long *)&(this->_qz).
                            super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[uVar13].
                            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                            ._M_impl.super__Vector_impl_data + lVar15),
                 &ndkSum.super__Vector_base<double,_std::allocator<double>_>);
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                (&ndkSum.super__Vector_base<double,_std::allocator<double>_>);
      for (uVar14 = 0; uVar4 = this->_K, uVar14 < uVar4; uVar14 = uVar14 + 1) {
        rVar16 = std::uniform_real_distribution<double>::operator()(&local_2758,&mt);
        *(result_type_conflict1 *)
         (*(long *)(*(long *)&(this->_qz).
                              super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[uVar13].
                              super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                              ._M_impl.super__Vector_impl_data + lVar15) + uVar14 * 8) = rVar16;
      }
      lVar10 = *(long *)&(this->_qz).
                         super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[uVar13].
                         super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                         ._M_impl.super__Vector_impl_data;
      dVar17 = 0.0;
      pdVar8 = *(double **)(lVar10 + lVar15);
      for (pdVar9 = pdVar8; pdVar9 != *(double **)(lVar10 + 8 + lVar15); pdVar9 = pdVar9 + 1) {
        dVar17 = dVar17 + *pdVar9;
      }
      for (uVar14 = 0; uVar4 != uVar14; uVar14 = uVar14 + 1) {
        pdVar8[uVar14] = pdVar8[uVar14] / dVar17;
      }
      uVar14 = (long)local_2788 + 1;
    }
    uVar13 = uVar13 + 1;
  }
  ndkSum.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  std::vector<double,_std::allocator<double>_>::_M_fill_assign
            (&this->_nd,(ulong)this->_D,(value_type_conflict2 *)&ndkSum);
  lVar15 = 1;
  for (uVar13 = 0; uVar13 < this->_D; uVar13 = uVar13 + 1) {
    pvVar6 = (this->_frequencyMatrix->
             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    dVar17 = std::
             accumulate<__gnu_cxx::__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,double>
                       ((__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                         )*(uint **)((long)pvVar6 + lVar15 * 8 + -8),
                        (__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                         )*(uint **)((long)&(pvVar6->
                                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                            )._M_impl.super__Vector_impl_data + lVar15 * 8),0.0);
    (this->_nd).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start[uVar13] = dVar17;
    lVar15 = lVar15 + 3;
  }
  lVar15 = 0;
  uVar13 = 0;
  local_2788 = &this->_nd;
  while( true ) {
    pvVar11 = (this->_ndk).
              super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pvVar7 = (this->_ndk).
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if ((ulong)(((long)pvVar7 - (long)pvVar11) / 0x18) <= uVar13) break;
    ndkSum.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    std::vector<double,_std::allocator<double>_>::_M_fill_assign
              ((vector<double,_std::allocator<double>_> *)
               ((long)&(pvVar11->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                       super__Vector_impl_data + lVar15),(ulong)this->_K,
               (value_type_conflict2 *)&ndkSum);
    uVar13 = uVar13 + 1;
    lVar15 = lVar15 + 0x18;
  }
  for (uVar13 = 0; uVar13 < (ulong)(((long)pvVar7 - (long)pvVar11) / 0x18); uVar13 = uVar13 + 1) {
    lVar15 = *(long *)&pvVar11[uVar13].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data;
    for (uVar14 = 0;
        uVar14 < (ulong)((long)*(pointer *)
                                ((long)&pvVar11[uVar13].
                                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                        super__Vector_impl_data + 8) - lVar15 >> 3);
        uVar14 = uVar14 + 1) {
      rVar16 = std::uniform_real_distribution<double>::operator()(&local_2758,&mt);
      pvVar11 = (this->_ndk).
                super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      lVar15 = *(long *)&pvVar11[uVar13].super__Vector_base<double,_std::allocator<double>_>._M_impl
                         .super__Vector_impl_data;
      *(result_type_conflict1 *)(lVar15 + uVar14 * 8) = rVar16;
    }
    pvVar7 = (this->_ndk).
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  }
  local_2790 = 0.0;
  std::vector<double,_std::allocator<double>_>::vector
            (&ndkSum,(ulong)this->_D,&local_2790,&local_2791);
  pvVar7 = (this->_ndk).
           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar15 = ((long)(this->_ndk).
                  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar7) / 0x18;
  for (lVar10 = 0; lVar10 != lVar15; lVar10 = lVar10 + 1) {
    dVar17 = 0.0;
    for (pdVar8 = pvVar7[lVar10].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pdVar8 != *(pointer *)
                   ((long)&pvVar7[lVar10].super__Vector_base<double,_std::allocator<double>_>.
                           _M_impl.super__Vector_impl_data + 8); pdVar8 = pdVar8 + 1) {
      dVar17 = dVar17 + *pdVar8;
    }
    ndkSum.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start[lVar10] = dVar17;
  }
  for (lVar10 = 0; lVar10 != lVar15; lVar10 = lVar10 + 1) {
    lVar1 = *(long *)&pvVar7[lVar10].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data;
    pdVar2 = *(pointer *)
              ((long)&pvVar7[lVar10].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data + 8);
    pdVar3 = (local_2788->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    for (lVar12 = 0; (long)pdVar2 - lVar1 >> 3 != lVar12; lVar12 = lVar12 + 1) {
      *(double *)(lVar1 + lVar12 * 8) =
           *(double *)(lVar1 + lVar12 * 8) /
           (ndkSum.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[lVar10] / pdVar3[lVar10]);
    }
  }
  lVar15 = 0;
  uVar13 = 0;
  while( true ) {
    pvVar11 = (this->_nkv).
              super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pvVar7 = (this->_nkv).
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if ((ulong)(((long)pvVar7 - (long)pvVar11) / 0x18) <= uVar13) break;
    local_2790 = 0.0;
    std::vector<double,_std::allocator<double>_>::_M_fill_assign
              ((vector<double,_std::allocator<double>_> *)
               ((long)&(pvVar11->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                       super__Vector_impl_data + lVar15),(ulong)this->_V,&local_2790);
    uVar13 = uVar13 + 1;
    lVar15 = lVar15 + 0x18;
  }
  uVar13 = 0;
  while( true ) {
    uVar14 = ((long)pvVar7 - (long)pvVar11) / 0x18;
    if (uVar14 <= uVar13) break;
    lVar15 = *(long *)&pvVar11[uVar13].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data;
    for (uVar14 = 0;
        uVar14 < (ulong)((long)*(pointer *)
                                ((long)&pvVar11[uVar13].
                                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                        super__Vector_impl_data + 8) - lVar15 >> 3);
        uVar14 = uVar14 + 1) {
      rVar16 = std::uniform_real_distribution<double>::operator()(&local_2758,&mt);
      pvVar11 = (this->_nkv).
                super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      lVar15 = *(long *)&pvVar11[uVar13].super__Vector_base<double,_std::allocator<double>_>._M_impl
                         .super__Vector_impl_data;
      *(result_type_conflict1 *)(lVar15 + uVar14 * 8) = rVar16;
    }
    uVar13 = uVar13 + 1;
    pvVar7 = (this->_nkv).
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  }
  dVar17 = 0.0;
  for (uVar13 = 0; uVar13 != uVar14; uVar13 = uVar13 + 1) {
    dVar18 = 0.0;
    for (pdVar8 = pvVar11[uVar13].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pdVar8 != *(pointer *)
                   ((long)&pvVar11[uVar13].super__Vector_base<double,_std::allocator<double>_>.
                           _M_impl.super__Vector_impl_data + 8); pdVar8 = pdVar8 + 1) {
      dVar18 = dVar18 + *pdVar8;
    }
    dVar17 = dVar17 + dVar18;
  }
  dVar18 = 0.0;
  for (pdVar8 = (this->_nd).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start;
      pdVar8 != (this->_nd).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish; pdVar8 = pdVar8 + 1) {
    dVar18 = dVar18 + *pdVar8;
  }
  for (uVar13 = 0; uVar13 != uVar14; uVar13 = uVar13 + 1) {
    lVar15 = *(long *)&pvVar11[uVar13].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data;
    pdVar2 = *(pointer *)
              ((long)&pvVar11[uVar13].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data + 8);
    for (lVar10 = 0; (long)pdVar2 - lVar15 >> 3 != lVar10; lVar10 = lVar10 + 1) {
      *(double *)(lVar15 + lVar10 * 8) = *(double *)(lVar15 + lVar10 * 8) / (dVar17 / dVar18);
    }
  }
  local_2790 = 0.0;
  std::vector<double,_std::allocator<double>_>::_M_fill_assign
            (&this->_nk,(ulong)this->_K,&local_2790);
  uVar4 = this->_K;
  pvVar7 = (this->_nkv).
           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pdVar2 = (this->_nk).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  for (uVar13 = 0; uVar13 != uVar4; uVar13 = uVar13 + 1) {
    dVar17 = 0.0;
    for (pdVar8 = pvVar7[uVar13].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pdVar8 != *(pointer *)
                   ((long)&pvVar7[uVar13].super__Vector_base<double,_std::allocator<double>_>.
                           _M_impl.super__Vector_impl_data + 8); pdVar8 = pdVar8 + 1) {
      dVar17 = dVar17 + *pdVar8;
    }
    pdVar2[uVar13] = dVar17;
  }
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&ndkSum.super__Vector_base<double,_std::allocator<double>_>);
  std::random_device::~random_device(&rnd);
  return;
}

Assistant:

void VariationalBayesEstimatorOnLDA::initializeParam(){//{{{
    for(int d=0; d<_thetaEx.size(); d++)_thetaEx[d].assign(_K, 0);
    for(int k=0; k<_phiEx.size(); k++)_phiEx[k].assign(_V, 0);
    for(int d=0; d<_ndk.size(); d++)_ndk[d].assign(_K, 0);
    for(int k=0; k<_nkv.size(); k++)_nkv[k].assign(_V, 0);
    _nk.assign(_K, 0);

    random_device rnd;
    mt19937 mt(rnd());
    uniform_real_distribution<double> randN(0, 1);
    for(int d=0; d<_docVoca.size(); d++){
        _qz[d] = vector<vector<double> >(_docVoca[d].size());
        for(int l=0; l<_docVoca[d].size(); l++){
            _qz[d][l] = vector<double>(_K);
            for(int k=0; k<_K; k++){
                double randomValue = randN(mt);
                _qz[d][l][k] = randomValue;
            }
            double qzSum = accumulate(_qz[d][l].begin(), _qz[d][l].end(), 0.0);
            for(int k=0; k<_K; k++){
                _qz[d][l][k] /= qzSum;
            }
        }
    }

    _nd.assign(_D, 0);
    for(int d=0;d<_D;d++){
        _nd[d] = accumulate(_frequencyMatrix[d].begin(), _frequencyMatrix[d].end(), 0.0);
    }

    for(int d=0;d<_ndk.size();d++)_ndk[d].assign(_K, 0);
    for(int d=0;d<_ndk.size();d++){
        for(int k=0;k<_ndk[d].size();k++){
            double randomValue=randN(mt);
            _ndk[d][k] = randomValue;
        }
    }
    vector<double> ndkSum(_D, 0);
    for(int d=0;d<_ndk.size();d++){
        ndkSum[d] = accumulate(_ndk[d].begin(), _ndk[d].end(), 0.0);
    }
    for(int d=0;d<_ndk.size();d++){
        for(int k=0;k<_ndk[d].size();k++){
            _ndk[d][k] /= ndkSum[d]/_nd[d];
        }
    }

    for(int k=0;k<_nkv.size();k++)_nkv[k].assign(_V, 0);
    for(int k=0;k<_nkv.size();k++){
        for(int v=0;v<_nkv[k].size();v++){
            double randomValue=randN(mt);
            _nkv[k][v] = randomValue;
        }
    }
    double Z = 0;
    for(int k=0;k<_nkv.size();k++){
        Z += accumulate(_nkv[k].begin(), _nkv[k].end(), 0.0);
    }
    double wordCount = accumulate(_nd.begin(), _nd.end(), 0.0);
    for(int k=0;k<_nkv.size();k++){
        for(int v=0;v<_nkv[k].size();v++){
            _nkv[k][v] /= Z/wordCount;
        }
    }

    _nk.assign(_K, 0);
    for(int k=0;k<_K;k++){
        _nk[k] = accumulate(_nkv[k].begin(), _nkv[k].end(), 0.0);
    }

}